

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * strAccumFinishRealloc(StrAccum *p)

{
  Vdbe *__dest;
  sqlite3 *in_RDI;
  char *zText;
  u64 in_stack_fffffffffffffff0;
  
  __dest = (Vdbe *)sqlite3DbMallocRaw(in_RDI,in_stack_fffffffffffffff0);
  if (__dest == (Vdbe *)0x0) {
    setStrAccumError((StrAccum *)in_RDI,'\a');
  }
  else {
    memcpy(__dest,in_RDI->pVdbe,(ulong)(*(int *)&in_RDI->mutex + 1));
    *(byte *)((long)&in_RDI->mutex + 5) = *(byte *)((long)&in_RDI->mutex + 5) | 4;
  }
  in_RDI->pVdbe = __dest;
  return (char *)__dest;
}

Assistant:

static SQLITE_NOINLINE char *strAccumFinishRealloc(StrAccum *p){
  char *zText;
  assert( p->mxAlloc>0 && !isMalloced(p) );
  zText = sqlite3DbMallocRaw(p->db, p->nChar+1 );
  if( zText ){
    memcpy(zText, p->zText, p->nChar+1);
    p->printfFlags |= SQLITE_PRINTF_MALLOCED;
  }else{
    setStrAccumError(p, SQLITE_NOMEM);
  }
  p->zText = zText;
  return zText;
}